

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_grow_filter_arena(Parser *this,size_t num_characters_needed)

{
  ulong uVar1;
  size_t num_characters;
  
  uVar1 = (this->m_filter_arena).len;
  if (uVar1 < num_characters_needed) {
    uVar1 = uVar1 * 2;
    if (uVar1 <= num_characters_needed) {
      uVar1 = num_characters_needed;
    }
    num_characters = 0x80;
    if (0x80 < uVar1) {
      num_characters = uVar1;
    }
    _resize_filter_arena(this,num_characters);
    return;
  }
  return;
}

Assistant:

void Parser::_grow_filter_arena(size_t num_characters_needed)
{
    _c4dbgpf("grow: arena={} numchars={}", m_filter_arena.len, num_characters_needed);
    if(num_characters_needed <= m_filter_arena.len)
        return;
    size_t sz = m_filter_arena.len << 1;
    _c4dbgpf("grow: sz={}", sz);
    sz = num_characters_needed > sz ? num_characters_needed : sz;
    _c4dbgpf("grow: sz={}", sz);
    sz = sz < 128u ? 128u : sz;
    _c4dbgpf("grow: sz={}", sz);
    _RYML_CB_ASSERT(m_stack.m_callbacks, sz >= num_characters_needed);
    _resize_filter_arena(sz);
}